

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdatabase.cpp
# Opt level: O2

QStringList * QFontDatabase::styles(QStringList *__return_storage_ptr__,QString *family)

{
  QtFontFoundry *pQVar1;
  QtFontStyle *pQVar2;
  int iVar3;
  Type *mutex;
  QtFontFamily *pQVar4;
  int j;
  long lVar5;
  int k;
  long lVar6;
  long in_FS_OFFSET;
  QtFontFoundry allStyles;
  QArrayDataPointer<char16_t> local_98;
  QArrayDataPointer<char16_t> local_78;
  QArrayDataPointer<char16_t> local_60;
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_78.d = (Data *)0x0;
  local_78.ptr = (char16_t *)0x0;
  local_78.size = 0;
  local_98.d = (Data *)0x0;
  local_98.ptr = (char16_t *)0x0;
  local_98.size = 0;
  parseFontName(family,(QString *)&local_98,(QString *)&local_78);
  local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  mutex = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fontDatabaseMutex>_>::
          operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fontDatabaseMutex>_>
                      *)family);
  QMutexLocker<QRecursiveMutex>::QMutexLocker((QMutexLocker<QRecursiveMutex> *)local_48,mutex);
  QFontDatabasePrivate::ensureFontDatabase();
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QString *)0x0;
  (__return_storage_ptr__->d).size = 0;
  pQVar4 = QFontDatabasePrivate::family
                     (&QFontDatabasePrivate::instance::instance,(QString *)&local_78,EnsurePopulated
                     );
  if (pQVar4 != (QtFontFamily *)0x0) {
    allStyles.styles = (QtFontStyle **)&DAT_aaaaaaaaaaaaaaaa;
    allStyles.name.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    allStyles._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
    allStyles.name.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    allStyles.name.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QtFontFoundry::QtFontFoundry(&allStyles,(QString *)&local_98);
    for (lVar5 = 0; lVar5 < pQVar4->count; lVar5 = lVar5 + 1) {
      pQVar1 = pQVar4->foundries[lVar5];
      if (local_98.size == 0) {
LAB_004283c4:
        for (lVar6 = 0; lVar6 < pQVar1->count; lVar6 = lVar6 + 1) {
          local_60.d = (Data *)CONCAT44(local_60.d._4_4_,0xaaaaaaaa);
          QtFontStyle::Key::Key((Key *)&local_60,&pQVar1->styles[lVar6]->key);
          local_60.d = (Data *)((ulong)local_60.d & 0xffffffffffff0fff);
          local_60.d._0_3_ = (uint3)(ushort)local_60.d;
          QtFontFoundry::style(&allStyles,(Key *)&local_60,&pQVar1->styles[lVar6]->styleName,true);
        }
      }
      else {
        iVar3 = QString::compare((QString *)pQVar1,(CaseSensitivity)&local_98);
        if (iVar3 == 0) goto LAB_004283c4;
      }
    }
    QList<QString>::reserve(__return_storage_ptr__,(long)allStyles.count);
    for (lVar5 = 0; lVar5 < allStyles.count; lVar5 = lVar5 + 1) {
      pQVar2 = allStyles.styles[lVar5];
      lVar6 = (pQVar2->styleName).d.size;
      if (lVar6 == 0) {
        styleStringHelper((QString *)&local_60,*(ushort *)&pQVar2->key >> 2 & 0x3ff,
                          *(ushort *)&pQVar2->key & (StyleOblique|StyleItalic));
      }
      else {
        local_60.d = (pQVar2->styleName).d.d;
        local_60.ptr = (pQVar2->styleName).d.ptr;
        local_60.size = lVar6;
        if (local_60.d != (Data *)0x0) {
          LOCK();
          ((local_60.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_60.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
      }
      QList<QString>::emplaceBack<QString>(__return_storage_ptr__,(QString *)&local_60);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
    }
    QtFontFoundry::~QtFontFoundry(&allStyles);
  }
  QMutexLocker<QRecursiveMutex>::~QMutexLocker((QMutexLocker<QRecursiveMutex> *)local_48);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QStringList QFontDatabase::styles(const QString &family)
{
    QString familyName, foundryName;
    parseFontName(family, foundryName, familyName);

    QMutexLocker locker(fontDatabaseMutex());
    QFontDatabasePrivate *d = QFontDatabasePrivate::ensureFontDatabase();

    QStringList l;
    QtFontFamily *f = d->family(familyName);
    if (!f)
        return l;

    QtFontFoundry allStyles(foundryName);
    for (int j = 0; j < f->count; j++) {
        QtFontFoundry *foundry = f->foundries[j];
        if (foundryName.isEmpty() || foundry->name.compare(foundryName, Qt::CaseInsensitive) == 0) {
            for (int k = 0; k < foundry->count; k++) {
                QtFontStyle::Key ke(foundry->styles[k]->key);
                ke.stretch = 0;
                allStyles.style(ke, foundry->styles[k]->styleName, true);
            }
        }
    }

    l.reserve(allStyles.count);
    for (int i = 0; i < allStyles.count; i++) {
        l.append(allStyles.styles[i]->styleName.isEmpty() ?
                 styleStringHelper(allStyles.styles[i]->key.weight,
                                   (QFont::Style)allStyles.styles[i]->key.style) :
                 allStyles.styles[i]->styleName);
    }
    return l;
}